

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O2

bool IsFloat(char *str)

{
  char cVar1;
  byte bVar2;
  byte *pbVar3;
  
  cVar1 = *str;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    cVar1 = str[1];
    str = str + 1;
  }
  if (cVar1 != '.') {
    str = IsNum(str);
    if ((byte *)str == (byte *)0x0) {
      return false;
    }
    bVar2 = *str;
    if (bVar2 != 0x2e) goto LAB_00377691;
  }
  str = IsNum((char *)((byte *)str + 1));
  if ((byte *)str == (byte *)0x0) {
    return false;
  }
  bVar2 = *str;
LAB_00377691:
  if ((bVar2 | 0x20) == 0x65) {
    if ((((byte *)str)[1] == 0x2d) || (((byte *)str)[1] == 0x2b)) {
      pbVar3 = (byte *)str + 2;
    }
    else {
      pbVar3 = (byte *)str + 1;
    }
    pbVar3 = (byte *)IsNum((char *)pbVar3);
    if (pbVar3 == (byte *)0x0) {
      return false;
    }
    bVar2 = *pbVar3;
  }
  return bVar2 == 0;
}

Assistant:

bool IsFloat (const char *str)
{
	const char *pt;
	
	if (*str == '+' || *str == '-')
		str++;

	if (*str == '.')
	{
		pt = str;
	}
	else
	{
		pt = IsNum (str);
		if (pt == NULL)
			return false;
	}
	if (*pt == '.')
	{
		pt = IsNum (pt+1);
		if (pt == NULL)
			return false;
	}
	if (*pt == 'e' || *pt == 'E')
	{
		pt++;
		if (*pt == '+' || *pt == '-')
			pt++;
		pt = IsNum (pt);
	}
	return pt != NULL && *pt == 0;
}